

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O3

void __thiscall pbrt::ParsedScene::EndOfFiles(ParsedScene *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppVar2;
  pointer ppVar3;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar4;
  size_t sVar5;
  char *pcVar6;
  pointer pSVar7;
  pointer pSVar8;
  pointer pAVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  int iVar12;
  iterator iVar13;
  const_iterator cVar14;
  _Rb_tree_node_base *p_Var15;
  _Rb_tree_node_base *p_Var16;
  _Base_ptr p_Var17;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar18;
  _Base_ptr p_Var19;
  pointer ppVar20;
  pointer pSVar21;
  pointer pSVar22;
  pointer pAVar23;
  GraphicsState *this_00;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *p_Var24;
  pointer ppVar25;
  long lVar26;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unusedSpectrumTextures;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unusedFloatTextures;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>
  f;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_430;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_400;
  _Rb_tree_node_base *local_3d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>
  local_3c8;
  
  if (this->currentBlock != WorldBlock) {
    SceneRepresentation::ErrorExitDeferred<>
              (&this->super_SceneRepresentation,"End of files before \"WorldBegin\".");
  }
  if ((this->pushedGraphicsStates).
      super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->pushedGraphicsStates).
      super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      SceneRepresentation::ErrorExitDeferred<>
                (&this->super_SceneRepresentation,"Missing end to AttributeBegin");
      this_00 = (this->pushedGraphicsStates).
                super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1;
      (this->pushedGraphicsStates).
      super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
      ._M_impl.super__Vector_impl_data._M_finish = this_00;
      GraphicsState::~GraphicsState(this_00);
    } while ((this->pushedGraphicsStates).
             super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this->pushedGraphicsStates).
             super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((this->super_SceneRepresentation).errorExit == true) {
    ErrorExit<>("Fatal errors during scene construction");
  }
  local_400._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_400._M_impl.super__Rb_tree_header._M_header;
  local_430._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_430._M_impl.super__Rb_tree_header._M_header;
  local_400._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_400._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_430._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_430._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_400._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_430._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppVar25 = (this->floatTextures).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->floatTextures).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_430._M_impl.super__Rb_tree_header._M_header._M_right =
       local_430._M_impl.super__Rb_tree_header._M_header._M_left;
  local_400._M_impl.super__Rb_tree_header._M_header._M_right =
       local_400._M_impl.super__Rb_tree_header._M_header._M_left;
  if (ppVar25 != ppVar2) {
    do {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>
      ::pair(&local_3c8,ppVar25);
      iVar13 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&local_400,&local_3c8.first);
      if ((_Rb_tree_header *)iVar13._M_node != &local_400._M_impl.super__Rb_tree_header) {
        LogFatal<char_const(&)[63]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp"
                   ,0x18a,"Check failed: %s",
                   (char (*) [63])"unusedFloatTextures.find(f.first) == unusedFloatTextures.end()");
      }
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_400,&local_3c8.first);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8.second.texName._M_dataplus._M_p != &local_3c8.second.texName.field_2) {
        operator_delete(local_3c8.second.texName._M_dataplus._M_p,
                        local_3c8.second.texName.field_2._M_allocated_capacity + 1);
      }
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::~InlinedVector(&local_3c8.second.super_TransformedSceneEntity.super_SceneEntity.parameters.
                        params);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8.second.super_TransformedSceneEntity.super_SceneEntity.name._M_dataplus._M_p
          != &local_3c8.second.super_TransformedSceneEntity.super_SceneEntity.name.field_2) {
        operator_delete(local_3c8.second.super_TransformedSceneEntity.super_SceneEntity.name.
                        _M_dataplus._M_p,
                        local_3c8.second.super_TransformedSceneEntity.super_SceneEntity.name.field_2
                        ._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8.first._M_dataplus._M_p != &local_3c8.first.field_2) {
        operator_delete(local_3c8.first._M_dataplus._M_p,
                        CONCAT71(local_3c8.first.field_2._M_allocated_capacity._1_7_,
                                 local_3c8.first.field_2._M_local_buf[0]) + 1);
      }
      ppVar25 = ppVar25 + 1;
    } while (ppVar25 != ppVar2);
  }
  ppVar25 = (this->spectrumTextures).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->spectrumTextures).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar25 != ppVar2) {
    do {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>
      ::pair(&local_3c8,ppVar25);
      iVar13 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&local_430,&local_3c8.first);
      if ((_Rb_tree_header *)iVar13._M_node != &local_430._M_impl.super__Rb_tree_header) {
        LogFatal<char_const(&)[69]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp"
                   ,0x18e,"Check failed: %s",
                   (char (*) [69])
                   "unusedSpectrumTextures.find(s.first) == unusedSpectrumTextures.end()");
      }
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_430,&local_3c8.first);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8.second.texName._M_dataplus._M_p != &local_3c8.second.texName.field_2) {
        operator_delete(local_3c8.second.texName._M_dataplus._M_p,
                        local_3c8.second.texName.field_2._M_allocated_capacity + 1);
      }
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::~InlinedVector(&local_3c8.second.super_TransformedSceneEntity.super_SceneEntity.parameters.
                        params);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8.second.super_TransformedSceneEntity.super_SceneEntity.name._M_dataplus._M_p
          != &local_3c8.second.super_TransformedSceneEntity.super_SceneEntity.name.field_2) {
        operator_delete(local_3c8.second.super_TransformedSceneEntity.super_SceneEntity.name.
                        _M_dataplus._M_p,
                        local_3c8.second.super_TransformedSceneEntity.super_SceneEntity.name.field_2
                        ._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8.first._M_dataplus._M_p != &local_3c8.first.field_2) {
        operator_delete(local_3c8.first._M_dataplus._M_p,
                        CONCAT71(local_3c8.first.field_2._M_allocated_capacity._1_7_,
                                 local_3c8.first.field_2._M_local_buf[0]) + 1);
      }
      ppVar25 = ppVar25 + 1;
    } while (ppVar25 != ppVar2);
  }
  ppVar3 = (this->namedMaterials).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar20 = (this->namedMaterials).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar20 != ppVar3; ppVar20 = ppVar20 + 1
      ) {
    paVar4 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
              *)(ppVar20->second).parameters.params.ptr;
    sVar5 = (ppVar20->second).parameters.params.nStored;
    paVar18 = &(ppVar20->second).parameters.params.field_2;
    if (paVar4 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                   *)0x0) {
      paVar18 = paVar4;
    }
    if (sVar5 != 0) {
      lVar26 = 0;
      do {
        pcVar6 = *(char **)((long)paVar18 + lVar26);
        iVar12 = std::__cxx11::string::compare(pcVar6);
        if (iVar12 == 0) {
          if (*(long *)(pcVar6 + 0x90) == 0) {
            LogFatal<char_const(&)[20]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp"
                       ,0x195,"Check failed: %s",(char (*) [20])"!p->strings.empty()");
          }
          cVar14._M_node =
               (_Base_ptr)
               std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&local_400,*(key_type **)(pcVar6 + 0x80));
          if ((_Rb_tree_header *)cVar14._M_node == &local_400._M_impl.super__Rb_tree_header) {
            cVar14._M_node =
                 (_Base_ptr)
                 std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&local_430,*(key_type **)(pcVar6 + 0x80));
            if ((_Rb_tree_header *)cVar14._M_node == &local_430._M_impl.super__Rb_tree_header)
            goto LAB_004f586d;
            p_Var24 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       *)&local_430;
          }
          else {
            p_Var24 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       *)&local_400;
          }
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::erase_abi_cxx11_(p_Var24,cVar14);
        }
LAB_004f586d:
        lVar26 = lVar26 + 8;
      } while (sVar5 << 3 != lVar26);
    }
  }
  pSVar7 = (this->materials).
           super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar21 = (this->materials).
                 super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>._M_impl.
                 super__Vector_impl_data._M_start; pSVar21 != pSVar7; pSVar21 = pSVar21 + 1) {
    paVar4 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
              *)(pSVar21->parameters).params.ptr;
    sVar5 = (pSVar21->parameters).params.nStored;
    paVar18 = &(pSVar21->parameters).params.field_2;
    if (paVar4 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                   *)0x0) {
      paVar18 = paVar4;
    }
    if (sVar5 != 0) {
      lVar26 = 0;
      do {
        pcVar6 = *(char **)((long)paVar18 + lVar26);
        iVar12 = std::__cxx11::string::compare(pcVar6);
        if (iVar12 == 0) {
          if (*(long *)(pcVar6 + 0x90) == 0) {
            LogFatal<char_const(&)[20]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp"
                       ,0x195,"Check failed: %s",(char (*) [20])"!p->strings.empty()");
          }
          cVar14._M_node =
               (_Base_ptr)
               std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&local_400,*(key_type **)(pcVar6 + 0x80));
          if ((_Rb_tree_header *)cVar14._M_node == &local_400._M_impl.super__Rb_tree_header) {
            cVar14._M_node =
                 (_Base_ptr)
                 std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&local_430,*(key_type **)(pcVar6 + 0x80));
            if ((_Rb_tree_header *)cVar14._M_node == &local_430._M_impl.super__Rb_tree_header)
            goto LAB_004f593a;
            p_Var24 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       *)&local_430;
          }
          else {
            p_Var24 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       *)&local_400;
          }
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::erase_abi_cxx11_(p_Var24,cVar14);
        }
LAB_004f593a:
        lVar26 = lVar26 + 8;
      } while (sVar5 << 3 != lVar26);
    }
  }
  ppVar2 = (this->floatTextures).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar25 = (this->floatTextures).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar25 != ppVar2; ppVar25 = ppVar25 + 1
      ) {
    paVar4 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
              *)(ppVar25->second).super_TransformedSceneEntity.super_SceneEntity.parameters.params.
                ptr;
    sVar5 = (ppVar25->second).super_TransformedSceneEntity.super_SceneEntity.parameters.params.
            nStored;
    paVar18 = &(ppVar25->second).super_TransformedSceneEntity.super_SceneEntity.parameters.params.
               field_2;
    if (paVar4 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                   *)0x0) {
      paVar18 = paVar4;
    }
    if (sVar5 != 0) {
      lVar26 = 0;
      do {
        pcVar6 = *(char **)((long)paVar18 + lVar26);
        iVar12 = std::__cxx11::string::compare(pcVar6);
        if (iVar12 == 0) {
          if (*(long *)(pcVar6 + 0x90) == 0) {
            LogFatal<char_const(&)[20]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp"
                       ,0x195,"Check failed: %s",(char (*) [20])"!p->strings.empty()");
          }
          cVar14._M_node =
               (_Base_ptr)
               std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&local_400,*(key_type **)(pcVar6 + 0x80));
          if ((_Rb_tree_header *)cVar14._M_node == &local_400._M_impl.super__Rb_tree_header) {
            cVar14._M_node =
                 (_Base_ptr)
                 std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&local_430,*(key_type **)(pcVar6 + 0x80));
            if ((_Rb_tree_header *)cVar14._M_node == &local_430._M_impl.super__Rb_tree_header)
            goto LAB_004f5a0a;
            p_Var24 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       *)&local_430;
          }
          else {
            p_Var24 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       *)&local_400;
          }
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::erase_abi_cxx11_(p_Var24,cVar14);
        }
LAB_004f5a0a:
        lVar26 = lVar26 + 8;
      } while (sVar5 << 3 != lVar26);
    }
  }
  ppVar2 = (this->spectrumTextures).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar25 = (this->spectrumTextures).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar25 != ppVar2; ppVar25 = ppVar25 + 1
      ) {
    paVar4 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
              *)(ppVar25->second).super_TransformedSceneEntity.super_SceneEntity.parameters.params.
                ptr;
    sVar5 = (ppVar25->second).super_TransformedSceneEntity.super_SceneEntity.parameters.params.
            nStored;
    paVar18 = &(ppVar25->second).super_TransformedSceneEntity.super_SceneEntity.parameters.params.
               field_2;
    if (paVar4 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                   *)0x0) {
      paVar18 = paVar4;
    }
    if (sVar5 != 0) {
      lVar26 = 0;
      do {
        pcVar6 = *(char **)((long)paVar18 + lVar26);
        iVar12 = std::__cxx11::string::compare(pcVar6);
        if (iVar12 == 0) {
          if (*(long *)(pcVar6 + 0x90) == 0) {
            LogFatal<char_const(&)[20]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp"
                       ,0x195,"Check failed: %s",(char (*) [20])"!p->strings.empty()");
          }
          cVar14._M_node =
               (_Base_ptr)
               std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&local_400,*(key_type **)(pcVar6 + 0x80));
          if ((_Rb_tree_header *)cVar14._M_node == &local_400._M_impl.super__Rb_tree_header) {
            cVar14._M_node =
                 (_Base_ptr)
                 std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&local_430,*(key_type **)(pcVar6 + 0x80));
            if ((_Rb_tree_header *)cVar14._M_node == &local_430._M_impl.super__Rb_tree_header)
            goto LAB_004f5ada;
            p_Var24 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       *)&local_430;
          }
          else {
            p_Var24 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       *)&local_400;
          }
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::erase_abi_cxx11_(p_Var24,cVar14);
        }
LAB_004f5ada:
        lVar26 = lVar26 + 8;
      } while (sVar5 << 3 != lVar26);
    }
  }
  pSVar8 = (this->shapes).
           super__Vector_base<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pSVar22 = (this->shapes).
                 super__Vector_base<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>
                 ._M_impl.super__Vector_impl_data._M_start; pSVar22 != pSVar8; pSVar22 = pSVar22 + 1
      ) {
    paVar4 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
              *)(pSVar22->super_SceneEntity).parameters.params.ptr;
    sVar5 = (pSVar22->super_SceneEntity).parameters.params.nStored;
    paVar18 = &(pSVar22->super_SceneEntity).parameters.params.field_2;
    if (paVar4 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                   *)0x0) {
      paVar18 = paVar4;
    }
    if (sVar5 != 0) {
      lVar26 = 0;
      do {
        pcVar6 = *(char **)((long)paVar18 + lVar26);
        iVar12 = std::__cxx11::string::compare(pcVar6);
        if (iVar12 == 0) {
          if (*(long *)(pcVar6 + 0x90) == 0) {
            LogFatal<char_const(&)[20]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp"
                       ,0x195,"Check failed: %s",(char (*) [20])"!p->strings.empty()");
          }
          cVar14._M_node =
               (_Base_ptr)
               std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&local_400,*(key_type **)(pcVar6 + 0x80));
          if ((_Rb_tree_header *)cVar14._M_node == &local_400._M_impl.super__Rb_tree_header) {
            cVar14._M_node =
                 (_Base_ptr)
                 std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&local_430,*(key_type **)(pcVar6 + 0x80));
            if ((_Rb_tree_header *)cVar14._M_node == &local_430._M_impl.super__Rb_tree_header)
            goto LAB_004f5ba7;
            p_Var24 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       *)&local_430;
          }
          else {
            p_Var24 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       *)&local_400;
          }
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::erase_abi_cxx11_(p_Var24,cVar14);
        }
LAB_004f5ba7:
        lVar26 = lVar26 + 8;
      } while (sVar5 << 3 != lVar26);
    }
  }
  pAVar23 = (this->animatedShapes).
            super__Vector_base<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pAVar9 = (this->animatedShapes).
           super__Vector_base<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pAVar23 == pAVar9) {
      p_Var15 = (this->instanceDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var16 = local_400._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_400._M_impl.super__Rb_tree_header._M_header._M_left = p_Var16;
        if ((_Rb_tree_header *)p_Var15 ==
            &(this->instanceDefinitions)._M_t._M_impl.super__Rb_tree_header) {
          if ((_Rb_tree_header *)p_Var16 != &local_400._M_impl.super__Rb_tree_header) {
            paVar1 = &local_3c8.first.field_2;
            do {
              if (LOGGING_LogLevel < 1) {
                local_3c8.first._M_string_length = 0;
                local_3c8.first.field_2._M_local_buf[0] = '\0';
                local_3c8.first._M_dataplus._M_p = (pointer)paVar1;
                detail::stringPrintfRecursive<std::__cxx11::string_const&>
                          (&local_3c8.first,"%s: float texture unused in scene",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var16 + 1));
                Log(Verbose,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp"
                    ,0x1b6,local_3c8.first._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3c8.first._M_dataplus._M_p != paVar1) {
                  operator_delete(local_3c8.first._M_dataplus._M_p,
                                  CONCAT71(local_3c8.first.field_2._M_allocated_capacity._1_7_,
                                           local_3c8.first.field_2._M_local_buf[0]) + 1);
                }
              }
              p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
            } while ((_Rb_tree_header *)p_Var16 != &local_400._M_impl.super__Rb_tree_header);
          }
          if ((_Rb_tree_header *)local_430._M_impl.super__Rb_tree_header._M_header._M_left !=
              &local_430._M_impl.super__Rb_tree_header) {
            paVar1 = &local_3c8.first.field_2;
            p_Var17 = local_430._M_impl.super__Rb_tree_header._M_header._M_left;
            do {
              if (LOGGING_LogLevel < 1) {
                local_3c8.first._M_string_length = 0;
                local_3c8.first.field_2._M_local_buf[0] = '\0';
                local_3c8.first._M_dataplus._M_p = (pointer)paVar1;
                detail::stringPrintfRecursive<std::__cxx11::string_const&>
                          (&local_3c8.first,"%s: spectrum texture unused in scene",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var17 + 1));
                Log(Verbose,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp"
                    ,0x1b8,local_3c8.first._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3c8.first._M_dataplus._M_p != paVar1) {
                  operator_delete(local_3c8.first._M_dataplus._M_p,
                                  CONCAT71(local_3c8.first.field_2._M_allocated_capacity._1_7_,
                                           local_3c8.first.field_2._M_local_buf[0]) + 1);
                }
              }
              p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
            } while ((_Rb_tree_header *)p_Var17 != &local_430._M_impl.super__Rb_tree_header);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_430);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_400);
          return;
        }
        p_Var10 = *(_Base_ptr *)(p_Var15 + 4);
        local_3d0 = p_Var15;
        for (p_Var17 = p_Var15[3]._M_right; p_Var17 != p_Var10; p_Var17 = p_Var17 + 9) {
          p_Var11 = p_Var17[3]._M_right;
          p_Var19 = (_Base_ptr)&p_Var17[1]._M_left;
          if (p_Var17[1]._M_parent != (_Base_ptr)0x0) {
            p_Var19 = p_Var17[1]._M_parent;
          }
          if (p_Var11 != (_Base_ptr)0x0) {
            lVar26 = 0;
            do {
              pcVar6 = *(char **)((long)&p_Var19->_M_color + lVar26);
              iVar12 = std::__cxx11::string::compare(pcVar6);
              if (iVar12 == 0) {
                if (*(long *)(pcVar6 + 0x90) == 0) {
                  LogFatal<char_const(&)[20]>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp"
                             ,0x195,"Check failed: %s",(char (*) [20])"!p->strings.empty()");
                }
                cVar14._M_node =
                     (_Base_ptr)
                     std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(&local_400,*(key_type **)(pcVar6 + 0x80));
                if ((_Rb_tree_header *)cVar14._M_node == &local_400._M_impl.super__Rb_tree_header) {
                  cVar14._M_node =
                       (_Base_ptr)
                       std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&local_430,*(key_type **)(pcVar6 + 0x80));
                  if ((_Rb_tree_header *)cVar14._M_node == &local_430._M_impl.super__Rb_tree_header)
                  goto LAB_004f5d5f;
                  p_Var24 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)&local_430;
                }
                else {
                  p_Var24 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)&local_400;
                }
                std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::erase_abi_cxx11_(p_Var24,cVar14);
              }
LAB_004f5d5f:
              lVar26 = lVar26 + 8;
            } while ((long)p_Var11 << 3 != lVar26);
          }
        }
        p_Var10 = local_3d0[4]._M_right;
        for (p_Var17 = local_3d0[4]._M_left; p_Var17 != p_Var10;
            p_Var17 = (_Base_ptr)&p_Var17[0x1e]._M_left) {
          p_Var11 = p_Var17[3]._M_right;
          p_Var19 = (_Base_ptr)&p_Var17[1]._M_left;
          if (p_Var17[1]._M_parent != (_Base_ptr)0x0) {
            p_Var19 = p_Var17[1]._M_parent;
          }
          if (p_Var11 != (_Base_ptr)0x0) {
            lVar26 = 0;
            do {
              pcVar6 = *(char **)((long)&p_Var19->_M_color + lVar26);
              iVar12 = std::__cxx11::string::compare(pcVar6);
              if (iVar12 == 0) {
                if (*(long *)(pcVar6 + 0x90) == 0) {
                  LogFatal<char_const(&)[20]>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp"
                             ,0x195,"Check failed: %s",(char (*) [20])"!p->strings.empty()");
                }
                cVar14._M_node =
                     (_Base_ptr)
                     std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(&local_400,*(key_type **)(pcVar6 + 0x80));
                if ((_Rb_tree_header *)cVar14._M_node == &local_400._M_impl.super__Rb_tree_header) {
                  cVar14._M_node =
                       (_Base_ptr)
                       std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&local_430,*(key_type **)(pcVar6 + 0x80));
                  if ((_Rb_tree_header *)cVar14._M_node == &local_430._M_impl.super__Rb_tree_header)
                  goto LAB_004f5e25;
                  p_Var24 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)&local_430;
                }
                else {
                  p_Var24 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)&local_400;
                }
                std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::erase_abi_cxx11_(p_Var24,cVar14);
              }
LAB_004f5e25:
              lVar26 = lVar26 + 8;
            } while ((long)p_Var11 << 3 != lVar26);
          }
        }
        p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_3d0);
        p_Var16 = local_400._M_impl.super__Rb_tree_header._M_header._M_left;
      } while( true );
    }
    paVar4 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
              *)(pAVar23->super_TransformedSceneEntity).super_SceneEntity.parameters.params.ptr;
    sVar5 = (pAVar23->super_TransformedSceneEntity).super_SceneEntity.parameters.params.nStored;
    paVar18 = &(pAVar23->super_TransformedSceneEntity).super_SceneEntity.parameters.params.field_2;
    if (paVar4 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                   *)0x0) {
      paVar18 = paVar4;
    }
    if (sVar5 != 0) {
      lVar26 = 0;
      do {
        pcVar6 = *(char **)((long)paVar18 + lVar26);
        iVar12 = std::__cxx11::string::compare(pcVar6);
        if (iVar12 == 0) {
          if (*(long *)(pcVar6 + 0x90) == 0) {
            LogFatal<char_const(&)[20]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp"
                       ,0x195,"Check failed: %s",(char (*) [20])"!p->strings.empty()");
          }
          cVar14._M_node =
               (_Base_ptr)
               std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&local_400,*(key_type **)(pcVar6 + 0x80));
          if ((_Rb_tree_header *)cVar14._M_node == &local_400._M_impl.super__Rb_tree_header) {
            cVar14._M_node =
                 (_Base_ptr)
                 std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&local_430,*(key_type **)(pcVar6 + 0x80));
            if ((_Rb_tree_header *)cVar14._M_node == &local_430._M_impl.super__Rb_tree_header)
            goto LAB_004f5c74;
            p_Var24 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       *)&local_430;
          }
          else {
            p_Var24 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       *)&local_400;
          }
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::erase_abi_cxx11_(p_Var24,cVar14);
        }
LAB_004f5c74:
        lVar26 = lVar26 + 8;
      } while (sVar5 << 3 != lVar26);
    }
    pAVar23 = pAVar23 + 1;
  } while( true );
}

Assistant:

void ParsedScene::EndOfFiles() {
    if (currentBlock != BlockState::WorldBlock)
        ErrorExitDeferred("End of files before \"WorldBegin\".");

    // Ensure there are no pushed graphics states
    while (!pushedGraphicsStates.empty()) {
        ErrorExitDeferred("Missing end to AttributeBegin");
        pushedGraphicsStates.pop_back();
    }

    if (errorExit)
        ErrorExit("Fatal errors during scene construction");

    // LOG_VERBOSE messages about any unused textures..
    std::set<std::string> unusedFloatTextures, unusedSpectrumTextures;
    for (const auto f : floatTextures) {
        CHECK(unusedFloatTextures.find(f.first) == unusedFloatTextures.end());
        unusedFloatTextures.insert(f.first);
    }
    for (const auto s : spectrumTextures) {
        CHECK(unusedSpectrumTextures.find(s.first) == unusedSpectrumTextures.end());
        unusedSpectrumTextures.insert(s.first);
    }

    auto checkVec = [&](const ParsedParameterVector &vec) {
        for (const ParsedParameter *p : vec) {
            if (p->type == "texture") {
                CHECK(!p->strings.empty());
                if (auto iter = unusedFloatTextures.find(p->strings[0]);
                    iter != unusedFloatTextures.end())
                    unusedFloatTextures.erase(iter);
                else if (auto iter = unusedSpectrumTextures.find(p->strings[0]);
                         iter != unusedSpectrumTextures.end())
                    unusedSpectrumTextures.erase(iter);
            }
        }
    };

    // Walk through everything that uses textures..
    for (const auto &nm : namedMaterials)
        checkVec(nm.second.parameters.GetParameterVector());
    for (const auto &m : materials)
        checkVec(m.parameters.GetParameterVector());
    for (const auto &ft : floatTextures)
        checkVec(ft.second.parameters.GetParameterVector());
    for (const auto &st : spectrumTextures)
        checkVec(st.second.parameters.GetParameterVector());
    for (const auto &s : shapes)
        checkVec(s.parameters.GetParameterVector());
    for (const auto &as : animatedShapes)
        checkVec(as.parameters.GetParameterVector());
    for (const auto &id : instanceDefinitions) {
        for (const auto &s : id.second.shapes)
            checkVec(s.parameters.GetParameterVector());
        for (const auto &as : id.second.animatedShapes)
            checkVec(as.parameters.GetParameterVector());
    }

    // And complain about what's left.
    for (const std::string &s : unusedFloatTextures)
        LOG_VERBOSE("%s: float texture unused in scene", s);
    for (const std::string &s : unusedSpectrumTextures)
        LOG_VERBOSE("%s: spectrum texture unused in scene", s);
}